

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

bool Fixpp::impl::
     doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<386u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<336u,Fixpp::Type::String>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<386u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<336u,Fixpp::Type::String>>>>::Visitor,0ul>
               (FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_> *message,int tag,Visitor *visitor)

{
  if (tag == 0x150) {
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<386u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
    ::Visitor::operator()(visitor,message);
    std::bitset<1UL>::set((bitset<1UL> *)&message[1].m_view.second,0,true);
  }
  return tag == 0x150;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }